

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O1

bool __thiscall
rtosc::UndoHistoryImpl::mergeEvent(UndoHistoryImpl *this,time_t now,char *msg,char *buf,size_t N)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *arguments;
  _Elt_pointer ppVar4;
  ulong uVar5;
  _Elt_pointer ppVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  rtosc_arg_t rVar10;
  rtosc_arg_t rVar11;
  rtosc_arg_t local_68;
  rtosc_arg_t local_58;
  rtosc_arg_t local_48;
  
  if (this->history_pos == 0) {
LAB_001113f5:
    bVar1 = false;
  }
  else {
    uVar8 = this->history_pos & 0xffffffff;
    do {
      uVar8 = uVar8 - 1;
      if ((int)(uint)uVar8 < 0) goto LAB_001113f5;
      ppVar4 = (this->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar7 = (ulong)((uint)uVar8 & 0x7fffffff);
      uVar3 = ((long)ppVar4 -
               (long)(this->history).
                     super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
      if (uVar3 < 0x20) {
        ppVar4 = ppVar4 + uVar7;
      }
      else {
        uVar5 = uVar3 >> 5 | 0xf800000000000000;
        if (0 < (long)uVar3) {
          uVar5 = uVar3 >> 5;
        }
        ppVar4 = (this->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] + uVar3 + uVar5 * -0x20;
      }
      dVar9 = difftime(now,ppVar4->first);
      if (2.0 < dVar9) goto LAB_001113f5;
      rVar10 = rtosc_argument(msg,0);
      ppVar4 = (this->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar3 = ((long)ppVar4 -
               (long)(this->history).
                     super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
      if (uVar3 < 0x20) {
        ppVar4 = ppVar4 + uVar7;
      }
      else {
        uVar5 = uVar3 >> 5 | 0xf800000000000000;
        if (0 < (long)uVar3) {
          uVar5 = uVar3 >> 5;
        }
        ppVar4 = (this->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] + uVar3 + uVar5 * -0x20;
      }
      rVar11 = rtosc_argument(ppVar4->second,0);
      iVar2 = strcmp(rVar10.s,rVar11.s);
    } while (iVar2 != 0);
    local_68 = rtosc_argument(msg,0);
    ppVar4 = (this->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar8 = ((long)ppVar4 -
             (long)(this->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
    if (uVar8 < 0x20) {
      ppVar4 = ppVar4 + uVar7;
    }
    else {
      uVar3 = uVar8 >> 5 | 0xf800000000000000;
      if (0 < (long)uVar8) {
        uVar3 = uVar8 >> 5;
      }
      ppVar4 = (this->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar3] + uVar8 + uVar3 * -0x20;
    }
    local_58 = rtosc_argument(ppVar4->second,1);
    local_48 = rtosc_argument(msg,2);
    arguments = rtosc_argument_string(msg);
    rtosc_amessage(buf,N,msg,arguments,&local_68);
    ppVar4 = (this->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar8 = ((long)ppVar4 -
             (long)(this->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
    if (uVar8 < 0x20) {
      ppVar4 = ppVar4 + uVar7;
    }
    else {
      uVar3 = uVar8 >> 5 | 0xf800000000000000;
      if (0 < (long)uVar8) {
        uVar3 = uVar8 >> 5;
      }
      ppVar4 = (this->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar3] + uVar8 + uVar3 * -0x20;
    }
    if (ppVar4->second != (char *)0x0) {
      operator_delete__(ppVar4->second);
    }
    ppVar4 = (this->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar8 = ((long)ppVar4 -
             (long)(this->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
    if (uVar8 < 0x20) {
      ppVar6 = ppVar4 + uVar7;
    }
    else {
      uVar3 = uVar8 >> 5 | 0xf800000000000000;
      if (0 < (long)uVar8) {
        uVar3 = uVar8 >> 5;
      }
      ppVar6 = (this->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar3] + uVar8 + uVar3 * -0x20;
    }
    ppVar6->second = buf;
    if (uVar8 < 0x20) {
      ppVar4 = ppVar4 + uVar7;
    }
    else {
      uVar3 = uVar8 >> 5 | 0xf800000000000000;
      if (0 < (long)uVar8) {
        uVar3 = uVar8 >> 5;
      }
      ppVar4 = (this->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar3] + uVar8 + uVar3 * -0x20;
    }
    ppVar4->first = now;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool UndoHistoryImpl::mergeEvent(time_t now, const char *msg, char *buf, size_t N)
{
    if(history_pos == 0)
        return false;
    for(int i=history_pos-1; i>=0; --i) {
        if(difftime(now, history[i].first) > 2)
            break;
        if(!strcmp(getUndoAddress(msg),
                    getUndoAddress(history[i].second)))
        {
            //We can splice events together, merging them into one event
            rtosc_arg_t args[3];
            args[0] = rtosc_argument(msg, 0);
            args[1] = rtosc_argument(history[i].second,1);
            args[2] = rtosc_argument(msg, 2);

            rtosc_amessage(buf, N, msg, rtosc_argument_string(msg), args);

            delete [] history[i].second;
            history[i].second = buf;
            history[i].first = now;
            return true;
        }
    }
    return false;
}